

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

type __thiscall
dg::pta::PointerGraph::nodeFactory<(dg::pta::PSNodeType)2,dg::pta::PSNode*&,dg::pta::PSNode>
          (PointerGraph *this,PSNode **args)

{
  type pPVar1;
  PSNode *in_RSI;
  PointerGraph *in_RDI;
  
  pPVar1 = (type)operator_new(0xe8);
  getNewNodeId(in_RDI);
  PSNode::PSNode<dg::pta::PSNode*&>
            (in_RSI,(IDType)((ulong)pPVar1 >> 0x20),(PSNodeType)pPVar1,(PSNode **)in_RDI);
  return pPVar1;
}

Assistant:

typename std::enable_if<std::is_same<Node, PSNode>::value, Node *>::type
    nodeFactory(Args &&...args) {
        static_assert(expected_args_size<Type, sizeof...(args)>() ==
                              sizeof...(args),
                      "Incorrect number of arguments");
        return new Node(getNewNodeId(), Type, std::forward<Args>(args)...);
    }